

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int gmatch(lua_State *L)

{
  lua_State *in_RDI;
  int in_stack_0000000c;
  lua_State *in_stack_00000010;
  int in_stack_00000024;
  lua_CFunction in_stack_00000028;
  lua_State *in_stack_00000030;
  
  luaL_checklstring(in_stack_00000010,in_stack_0000000c,(size_t *)L);
  luaL_checklstring(in_stack_00000010,in_stack_0000000c,(size_t *)L);
  lua_settop(in_RDI,2);
  lua_pushinteger(in_RDI,0);
  lua_pushcclosure(in_stack_00000030,in_stack_00000028,in_stack_00000024);
  return 1;
}

Assistant:

static int gmatch(lua_State*L){
luaL_checkstring(L,1);
luaL_checkstring(L,2);
lua_settop(L,2);
lua_pushinteger(L,0);
lua_pushcclosure(L,gmatch_aux,3);
return 1;
}